

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_string.c
# Opt level: O3

void print_string_should_print_ascii(void)

{
  char cVar1;
  long lVar2;
  long in_FS_OFFSET;
  int iVar3;
  int iVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  char ascii [127];
  char local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0;
  do {
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6 = (auVar4 | _DAT_001050f0) ^ _DAT_00105110;
    iVar3 = auVar6._0_4_;
    iVar5 = auVar6._8_4_;
    auVar15._4_4_ = iVar3;
    auVar15._0_4_ = iVar3;
    auVar15._8_4_ = iVar5;
    auVar15._12_4_ = iVar5;
    auVar23._0_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar23._4_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar23._8_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar23._12_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar7._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar7._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar7._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar7._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar7 = auVar7 & auVar23;
    auVar6 = pshuflw(auVar15,auVar7,0xe8);
    auVar6 = packssdw(auVar6,auVar6);
    cVar1 = (char)lVar2;
    if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_88[lVar2] = cVar1 + '\x01';
    }
    auVar6 = packssdw(auVar7,auVar7);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._0_4_ >> 8 & 1) != 0) {
      local_88[lVar2 + 1] = cVar1 + '\x02';
    }
    auVar6 = (auVar4 | _DAT_001050e0) ^ _DAT_00105110;
    iVar3 = auVar6._0_4_;
    iVar5 = auVar6._8_4_;
    auVar16._4_4_ = iVar3;
    auVar16._0_4_ = iVar3;
    auVar16._8_4_ = iVar5;
    auVar16._12_4_ = iVar5;
    auVar24._0_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar24._4_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar24._8_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar24._12_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar8._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar8._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar8._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar8._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar8 = auVar8 & auVar24;
    auVar6 = packssdw(auVar16,auVar8);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._0_4_ >> 0x10 & 1) != 0) {
      local_88[lVar2 + 2] = cVar1 + '\x03';
    }
    auVar6 = pshufhw(auVar8,auVar8,0x84);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._0_4_ >> 0x18 & 1) != 0) {
      local_88[lVar2 + 3] = cVar1 + '\x04';
    }
    auVar6 = (auVar4 | _DAT_001050d0) ^ _DAT_00105110;
    iVar3 = auVar6._0_4_;
    iVar5 = auVar6._8_4_;
    auVar17._4_4_ = iVar3;
    auVar17._0_4_ = iVar3;
    auVar17._8_4_ = iVar5;
    auVar17._12_4_ = iVar5;
    auVar25._0_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar25._4_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar25._8_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar25._12_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar9._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar9._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar9._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar9._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar9 = auVar9 & auVar25;
    auVar6 = pshuflw(auVar17,auVar9,0xe8);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_88[lVar2 + 4] = cVar1 + '\x05';
    }
    auVar6 = packssdw(auVar9,auVar9);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._4_2_ >> 8 & 1) != 0) {
      local_88[lVar2 + 5] = cVar1 + '\x06';
    }
    auVar6 = (auVar4 | _DAT_001050c0) ^ _DAT_00105110;
    iVar3 = auVar6._0_4_;
    iVar5 = auVar6._8_4_;
    auVar18._4_4_ = iVar3;
    auVar18._0_4_ = iVar3;
    auVar18._8_4_ = iVar5;
    auVar18._12_4_ = iVar5;
    auVar26._0_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar26._4_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar26._8_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar26._12_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar10._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar10._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar10._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar10._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar10 = auVar10 & auVar26;
    auVar6 = packssdw(auVar18,auVar10);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_88[lVar2 + 6] = cVar1 + '\a';
    }
    auVar6 = pshufhw(auVar10,auVar10,0x84);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._6_2_ >> 8 & 1) != 0) {
      local_88[lVar2 + 7] = cVar1 + '\b';
    }
    auVar6 = (auVar4 | _DAT_001050b0) ^ _DAT_00105110;
    iVar3 = auVar6._0_4_;
    iVar5 = auVar6._8_4_;
    auVar19._4_4_ = iVar3;
    auVar19._0_4_ = iVar3;
    auVar19._8_4_ = iVar5;
    auVar19._12_4_ = iVar5;
    auVar27._0_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar27._4_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar27._8_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar27._12_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar11._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar11._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar11._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar11._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar11 = auVar11 & auVar27;
    auVar6 = pshuflw(auVar19,auVar11,0xe8);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_88[lVar2 + 8] = cVar1 + '\t';
    }
    auVar6 = packssdw(auVar11,auVar11);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._8_2_ >> 8 & 1) != 0) {
      local_88[lVar2 + 9] = cVar1 + '\n';
    }
    auVar6 = (auVar4 | _DAT_001050a0) ^ _DAT_00105110;
    iVar3 = auVar6._0_4_;
    iVar5 = auVar6._8_4_;
    auVar20._4_4_ = iVar3;
    auVar20._0_4_ = iVar3;
    auVar20._8_4_ = iVar5;
    auVar20._12_4_ = iVar5;
    auVar28._0_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar28._4_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar28._8_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar28._12_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar12._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar12._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar12._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar12._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar12 = auVar12 & auVar28;
    auVar6 = packssdw(auVar20,auVar12);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_88[lVar2 + 10] = cVar1 + '\v';
    }
    auVar6 = pshufhw(auVar12,auVar12,0x84);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._10_2_ >> 8 & 1) != 0) {
      local_88[lVar2 + 0xb] = cVar1 + '\f';
    }
    auVar6 = (auVar4 | _DAT_00105090) ^ _DAT_00105110;
    iVar3 = auVar6._0_4_;
    iVar5 = auVar6._8_4_;
    auVar21._4_4_ = iVar3;
    auVar21._0_4_ = iVar3;
    auVar21._8_4_ = iVar5;
    auVar21._12_4_ = iVar5;
    auVar29._0_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar29._4_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar29._8_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar29._12_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar13._0_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar13._4_4_ = -(uint)(auVar6._4_4_ == -0x80000000);
    auVar13._8_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar13._12_4_ = -(uint)(auVar6._12_4_ == -0x80000000);
    auVar13 = auVar13 & auVar29;
    auVar6 = pshuflw(auVar21,auVar13,0xe8);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_88[lVar2 + 0xc] = cVar1 + '\r';
    }
    auVar6 = packssdw(auVar13,auVar13);
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    if ((auVar6._12_2_ >> 8 & 1) != 0) {
      local_88[lVar2 + 0xd] = cVar1 + '\x0e';
    }
    auVar4 = (auVar4 | _DAT_00105080) ^ _DAT_00105110;
    iVar3 = auVar4._0_4_;
    iVar5 = auVar4._8_4_;
    auVar14._4_4_ = iVar3;
    auVar14._0_4_ = iVar3;
    auVar14._8_4_ = iVar5;
    auVar14._12_4_ = iVar5;
    auVar22._0_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar22._4_4_ = -(uint)(iVar3 < -0x7fffff82);
    auVar22._8_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar22._12_4_ = -(uint)(iVar5 < -0x7fffff82);
    auVar6._0_4_ = -(uint)(auVar4._4_4_ == -0x80000000);
    auVar6._4_4_ = -(uint)(auVar4._4_4_ == -0x80000000);
    auVar6._8_4_ = -(uint)(auVar4._12_4_ == -0x80000000);
    auVar6._12_4_ = -(uint)(auVar4._12_4_ == -0x80000000);
    auVar6 = auVar6 & auVar22;
    auVar4 = packssdw(auVar14,auVar6);
    auVar4 = packssdw(auVar4,auVar4);
    auVar4 = packsswb(auVar4,auVar4);
    if ((auVar4 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_88[lVar2 + 0xe] = cVar1 + '\x0f';
    }
    auVar4 = pshufhw(auVar6,auVar6,0x84);
    auVar4 = packssdw(auVar4,auVar4);
    auVar4 = packsswb(auVar4,auVar4);
    if ((auVar4._14_2_ >> 8 & 1) != 0) {
      local_88[lVar2 + 0xf] = cVar1 + '\x10';
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x80);
  local_88[0x7e] = 0;
  assert_print_string("\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\\t\\n\\u000b\\f\\r\\u000e\\u000f\\u0010\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f !\\\"#$%&\'()*+,-./0123456789:;<=>?@ABCDEFGHIJKLMNOPQRSTUVWXYZ[\\\\]^_`abcdefghijklmnopqrstuvwxyz{|}~\""
                      ,local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void print_string_should_print_ascii(void)
{
    char ascii[0x7F];
    size_t i = 1;

    /* create ascii table */
    for (i = 1; i < 0x7F; i++)
    {
        ascii[i-1] = (char)i;
    }
    ascii[0x7F-1] = '\0';

    assert_print_string("\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\\t\\n\\u000b\\f\\r\\u000e\\u000f\\u0010\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f !\\\"#$%&'()*+,-./0123456789:;<=>?@ABCDEFGHIJKLMNOPQRSTUVWXYZ[\\\\]^_`abcdefghijklmnopqrstuvwxyz{|}~\"",
            ascii);
}